

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O3

int ctr_drbg_update_internal(mbedtls_ctr_drbg_context *ctx,uchar *data)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint *puVar6;
  uint uVar7;
  bool bVar8;
  uchar tmp [48];
  uint local_58 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  
  puVar6 = local_58;
  local_38 = 0;
  uStack_30 = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  uVar7 = 0;
  do {
    lVar5 = 0xf;
    do {
      if (lVar5 == -1) break;
      puVar1 = ctx->counter + lVar5;
      *puVar1 = *puVar1 + '\x01';
      lVar5 = lVar5 + -1;
    } while (*puVar1 == '\0');
    iVar4 = mbedtls_aes_crypt_ecb(&ctx->aes_ctx,1,ctx->counter,(uchar *)puVar6);
    if (iVar4 != 0) {
      return iVar4;
    }
    puVar6 = (uint *)((long)puVar6 + 0x10);
    bVar8 = 0x1f < uVar7;
    uVar7 = uVar7 + 0x10;
    if (bVar8) {
      lVar5 = 0;
      do {
        puVar6 = (uint *)(data + lVar5);
        uVar7 = puVar6[1];
        uVar2 = puVar6[2];
        uVar3 = puVar6[3];
        *(uint *)((long)local_58 + lVar5) = *puVar6 ^ *(uint *)((long)local_58 + lVar5);
        *(uint *)((long)local_58 + lVar5 + 4) = uVar7 ^ *(uint *)((long)local_58 + lVar5 + 4);
        *(uint *)((long)local_58 + lVar5 + 8) = uVar2 ^ *(uint *)((long)local_58 + lVar5 + 8);
        *(uint *)((long)local_58 + lVar5 + 0xc) = uVar3 ^ *(uint *)((long)local_58 + lVar5 + 0xc);
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x30);
      iVar4 = mbedtls_aes_setkey_enc(&ctx->aes_ctx,(uchar *)local_58,0x100);
      if (iVar4 == 0) {
        *(undefined8 *)ctx->counter = local_38;
        *(undefined8 *)(ctx->counter + 8) = uStack_30;
        iVar4 = 0;
      }
      return iVar4;
    }
  } while( true );
}

Assistant:

static int ctr_drbg_update_internal( mbedtls_ctr_drbg_context *ctx,
                              const unsigned char data[MBEDTLS_CTR_DRBG_SEEDLEN] )
{
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char *p = tmp;
    int i, j;
    int ret = 0;

    memset( tmp, 0, MBEDTLS_CTR_DRBG_SEEDLEN );

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        /*
         * Increase counter
         */
        for( i = MBEDTLS_CTR_DRBG_BLOCKSIZE; i > 0; i-- )
            if( ++ctx->counter[i - 1] != 0 )
                break;

        /*
         * Crypt counter block
         */
        if( ( ret = mbedtls_aes_crypt_ecb( &ctx->aes_ctx, MBEDTLS_AES_ENCRYPT, ctx->counter, p ) ) != 0 )
        {
            return( ret );
        }

        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }

    for( i = 0; i < MBEDTLS_CTR_DRBG_SEEDLEN; i++ )
        tmp[i] ^= data[i];

    /*
     * Update key and counter
     */
    if( ( ret = mbedtls_aes_setkey_enc( &ctx->aes_ctx, tmp, MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        return( ret );
    }
    memcpy( ctx->counter, tmp + MBEDTLS_CTR_DRBG_KEYSIZE, MBEDTLS_CTR_DRBG_BLOCKSIZE );

    return( 0 );
}